

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashtbl.c
# Opt level: O0

void * tommy_hashtable_remove_existing(tommy_hashtable *hashtable,tommy_hashtable_node *node)

{
  long lVar1;
  long in_FS_OFFSET;
  tommy_count_t pos;
  tommy_hashtable_node *node_local;
  tommy_hashtable *hashtable_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tommy_list_remove_existing(hashtable->bucket + (node->key & hashtable->bucket_mask),node);
  hashtable->count = hashtable->count - 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return node->data;
  }
  __stack_chk_fail();
}

Assistant:

void* tommy_hashtable_remove_existing(tommy_hashtable* hashtable, tommy_hashtable_node* node)
{
	tommy_count_t pos = node->key & hashtable->bucket_mask;

	tommy_list_remove_existing(&hashtable->bucket[pos], node);

	--hashtable->count;

	return node->data;
}